

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O1

int wally_base58_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  byte *pbVar1;
  long lVar2;
  char *pcVar3;
  undefined1 *dest;
  undefined1 *puVar4;
  uchar *puVar5;
  undefined1 *puVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uchar *bytes_out;
  undefined1 *size;
  ulong uVar15;
  ulong __n;
  uint32_t checksum;
  uchar bn_buf [512];
  undefined4 local_258 [8];
  undefined1 local_238 [520];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  size = (undefined1 *)0x0;
  iVar7 = -2;
  dest = local_238;
  if ((((bytes != (uchar *)0x0) && (bytes_len != 0)) && (flags < 2)) &&
     (size = (undefined1 *)0x0, output != (char **)0x0)) {
    if (flags == 0) {
      bytes_out = (uchar *)0x0;
      uVar13 = bytes_len;
    }
    else {
      bytes_out = (uchar *)local_258;
      wally_sha256d(bytes,bytes_len,bytes_out,0x20);
      wally_clear(bytes_out,0x20);
      uVar13 = bytes_len + 4;
    }
    if (uVar13 == 0) {
      __n = 0;
    }
    else {
      uVar15 = 0;
      do {
        puVar5 = bytes_out + -bytes_len;
        if (uVar15 < bytes_len) {
          puVar5 = bytes;
        }
        __n = uVar15;
      } while ((puVar5[uVar15] == '\0') && (uVar15 = uVar15 + 1, __n = uVar13, uVar13 != uVar15));
    }
    if (uVar13 - __n == 0) {
      pcVar3 = (char *)wally_malloc(__n + 1);
      *output = pcVar3;
      if (pcVar3 != (char *)0x0) {
        memset(pcVar3,0x31,__n);
        (*output)[__n] = '\0';
        return 0;
      }
      iVar7 = -3;
      size = (undefined1 *)0x0;
      dest = local_238;
    }
    else {
      uVar15 = (uVar13 - __n) * 0x8a;
      uVar8 = uVar15 / 100;
      if (uVar15 < 0xc800) {
        dest = local_238;
      }
      else {
        size = (undefined1 *)(uVar8 + 1);
        dest = (undefined1 *)wally_malloc((size_t)size);
        if (dest == (undefined1 *)0x0) {
          iVar7 = -3;
          dest = (undefined1 *)0x0;
          goto LAB_0016363b;
        }
      }
      pbVar1 = dest + uVar8;
      dest[uVar8] = 0;
      uVar15 = __n;
      pbVar9 = pbVar1;
      if (__n < uVar13) {
        do {
          if (pbVar9 <= pbVar1) {
            pbVar11 = bytes_out + (uVar15 - bytes_len);
            if (uVar15 < bytes_len) {
              pbVar11 = bytes + uVar15;
            }
            uVar10 = (uint)*pbVar11;
            pbVar11 = pbVar1;
            do {
              uVar12 = (uint)*pbVar11 * 0x100 + uVar10;
              uVar10 = uVar12 / 0x3a;
              *pbVar11 = (char)uVar12 + (char)(uVar12 / 0x3a) * -0x3a;
              if ((pbVar11 == pbVar9) && (0x39 < uVar12)) {
                pbVar9[-1] = 0;
                pbVar9 = pbVar9 + -1;
              }
              pbVar11 = pbVar11 + -1;
            } while (pbVar9 <= pbVar11);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
      lVar14 = __n + 2;
      puVar4 = (undefined1 *)0x0;
      do {
        puVar6 = puVar4;
        puVar4 = puVar6 + 1;
        lVar14 = lVar14 + -1;
        if (pbVar1 <= pbVar9 + (long)puVar6) break;
      } while (pbVar9[(long)puVar6] == 0);
      lVar2 = uVar8 - (long)pbVar9;
      size = dest + (lVar2 - (long)puVar4) + 2;
      pcVar3 = (char *)wally_malloc((size_t)(dest + (((__n + uVar8) - (long)pbVar9) - (long)puVar4)
                                                    + 3));
      *output = pcVar3;
      if (pcVar3 == (char *)0x0) {
        iVar7 = -3;
      }
      else {
        memset(pcVar3,0x31,__n);
        if (dest + lVar2 + 2 != puVar4) {
          puVar4 = (undefined1 *)0x0;
          do {
            (*output)[(long)(puVar4 + __n)] =
                 "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"
                 [pbVar9[(long)(puVar6 + (long)puVar4)]];
            puVar4 = puVar4 + 1;
          } while (puVar4 < size);
        }
        (*output)[(long)(dest + lVar14 + lVar2)] = '\0';
        iVar7 = 0;
      }
    }
  }
LAB_0016363b:
  if ((dest != (undefined1 *)0x0) && (wally_clear(dest,(size_t)size), dest != local_238)) {
    wally_free(dest);
  }
  return iVar7;
}

Assistant:

int wally_base58_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    uint32_t checksum, *cs_p = NULL;
    unsigned char bn_buf[BIGNUM_BYTES];
    unsigned char *bn = bn_buf, *top_byte, *bn_p;
    size_t bn_bytes = 0, zeros, i, orig_len = bytes_len;
    int ret = WALLY_EINVAL;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || (flags & ~BASE58_ALL_DEFINED_FLAGS) || !output)
        goto cleanup; /* Invalid argument */

    if (flags & BASE58_FLAG_CHECKSUM) {
        checksum = base58_get_checksum(bytes, bytes_len);
        cs_p = &checksum;
        bytes_len += 4;
    }

#define b(n) (n < orig_len ? bytes[n] : ((unsigned char *)cs_p)[n - orig_len])

    /* Process leading zeros */
    for (zeros = 0; zeros < bytes_len && !b(zeros); ++zeros)
        ; /* no-op*/

    if (zeros == bytes_len) {
        if (!(*output = wally_malloc(zeros + 1))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

        memset(*output, '1', zeros);
        (*output)[zeros] = '\0';
        return WALLY_OK; /* All 0's */
    }

    bn_bytes = (bytes_len - zeros) * 138 / 100 + 1; /* log(256)/log(58) rounded up */

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_bytes > BIGNUM_BYTES)
        if (!(bn = wally_malloc(bn_bytes))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    top_byte = bn + bn_bytes - 1;
    *top_byte = 0;

    for (i = zeros; i < bytes_len; ++i) {
        uint32_t carry = b(i);
        for (bn_p = bn + bn_bytes - 1; bn_p >= top_byte; --bn_p) {
            carry = *bn_p * 256 + carry;
            *bn_p = carry % 58;
            carry = carry / 58;
            if (carry && bn_p == top_byte)
                *--top_byte = 0; /* Increase bignum size */
        }
    }

    while (!*top_byte && top_byte < bn + bn_bytes - 1)
        ++top_byte; /* Skip leading zero bytes in our bignum */

    /* Copy the result */
    bn_bytes = bn + bn_bytes - top_byte;

    if (!(*output = wally_malloc(zeros + bn_bytes + 1))) {
        ret = WALLY_ENOMEM;
        goto cleanup;
    }

    memset(*output, '1', zeros);
    for (i = 0; i < bn_bytes; ++i)
        (*output)[zeros + i] = byte_to_base58[top_byte[i]];
    (*output)[zeros + bn_bytes] = '\0';

    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_bytes);
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
#undef b
}